

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXModel.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::Model::Model(Model *this,uint64_t id,Element *element,Document *doc,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  *this_01;
  const_iterator cVar4;
  Token *pTVar5;
  Token *t;
  _Rb_tree_header *p_Var6;
  Element *el;
  Element *el_00;
  key_type local_90;
  string *local_70;
  string *local_68;
  Document *local_60;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_60 = doc;
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Model_009a6240;
  local_68 = (string *)&this->shading;
  paVar1 = &(this->shading).field_2;
  (this->materials).
  super__Vector_base<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->materials).
  super__Vector_base<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->materials).
  super__Vector_base<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->geometry).
  super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->geometry).
  super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->geometry).
  super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->attributes).
  super__Vector_base<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->attributes).
  super__Vector_base<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->attributes).
  super__Vector_base<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->shading)._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>(local_68,"Y","");
  local_70 = (string *)&this->culling;
  local_40 = &(this->culling).field_2;
  (this->culling)._M_dataplus._M_p = (pointer)local_40;
  (this->culling)._M_string_length = 0;
  (this->culling).field_2._M_local_buf[0] = '\0';
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38 = paVar1;
  this_01 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
             *)GetRequiredScope(element);
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Shading","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::find(this_01,&local_90);
  p_Var6 = &(this_01->_M_impl).super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar4._M_node == p_Var6) {
    el_00 = (Element *)0x0;
  }
  else {
    el_00 = *(Element **)(cVar4._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Culling","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::find(this_01,&local_90);
  if ((_Rb_tree_header *)cVar4._M_node == p_Var6) {
    el = (Element *)0x0;
  }
  else {
    el = *(Element **)(cVar4._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (el_00 != (Element *)0x0) {
    pTVar5 = GetRequiredToken(el_00,0);
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pTVar5->sbegin,pTVar5->send)
    ;
    std::__cxx11::string::operator=(local_68,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  if (el != (Element *)0x0) {
    pTVar5 = GetRequiredToken(el,0);
    ParseTokenAsString_abi_cxx11_(&local_90,(FBX *)pTVar5,t);
    std::__cxx11::string::operator=(local_70,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Model.FbxNode","");
  Util::GetPropertyTable((Util *)&local_58,local_60,&local_90,element,(Scope *)this_01,false);
  p_Var3 = p_Stack_50;
  peVar2 = local_58;
  local_58 = (element_type *)0x0;
  p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->props).
            super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar2;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  ResolveLinks(this,element,local_60);
  return;
}

Assistant:

Model::Model(uint64_t id, const Element& element, const Document& doc, const std::string& name)
    : Object(id,element,name)
    , shading("Y")
{
    const Scope& sc = GetRequiredScope(element);
    const Element* const Shading = sc["Shading"];
    const Element* const Culling = sc["Culling"];

    if(Shading) {
        shading = GetRequiredToken(*Shading,0).StringContents();
    }

    if (Culling) {
        culling = ParseTokenAsString(GetRequiredToken(*Culling,0));
    }

    props = GetPropertyTable(doc,"Model.FbxNode",element,sc);
    ResolveLinks(element,doc);
}